

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeout.c
# Opt level: O3

void burn_object(void *arg,long timeout)

{
  byte bVar1;
  short sVar2;
  ushort uVar3;
  boolean bVar4;
  int iVar5;
  long lVar6;
  uint uVar7;
  char *pcVar8;
  char *pcVar9;
  char *pcVar10;
  char *pcVar11;
  bool bVar12;
  bool bVar13;
  xchar y;
  xchar x;
  char whose [256];
  char local_12a;
  char local_129;
  char local_128 [264];
  
  sVar2 = *(short *)((long)arg + 0x2a);
  if (sVar2 == 0x10b) {
    bVar13 = SBORROW1(*(char *)((long)arg + 0x34),'\x02');
    bVar12 = (char)(*(char *)((long)arg + 0x34) + -2) < '\0';
  }
  else {
    bVar13 = SBORROW4(*(int *)((long)arg + 0x30),2);
    bVar12 = *(int *)((long)arg + 0x30) + -2 < 0;
  }
  bVar12 = bVar13 == bVar12;
  lVar6 = (ulong)moves - timeout;
  if (lVar6 != 0) {
    if (lVar6 < *(int *)((long)arg + 0x5c)) {
      *(int *)((long)arg + 0x5c) = *(int *)((long)arg + 0x5c) - (int)lVar6;
      begin_burn(level,(obj *)arg,'\x01');
      return;
    }
    *(undefined4 *)((long)arg + 0x5c) = 0;
    end_burn((obj *)arg,'\0');
    if (sVar2 == 0x10b) {
      *(undefined1 *)((long)arg + 0x34) = 0;
      iVar5 = weight((obj *)arg);
      *(int *)((long)arg + 0x2c) = iVar5;
      if (*(char *)((long)arg + 0x48) != '\x03') {
        return;
      }
      encumber_msg();
      return;
    }
    if ((1 < *(ushort *)((long)arg + 0x2a) - 0xe5) && (*(ushort *)((long)arg + 0x2a) != 0x142)) {
      return;
    }
    obj_extract_self((obj *)arg);
    obfree((obj *)arg,(obj *)0x0);
    return;
  }
  bVar4 = get_obj_location((obj *)arg,&local_129,&local_12a,0);
  if (bVar4 == '\0') {
    bVar13 = true;
  }
  else {
    if (u.uprops[0x1e].intrinsic == 0) {
      if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0025f2ef;
      if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0025f2e6;
LAB_0025f3e2:
      bVar13 = (viz_array[local_12a][local_129] & 2U) == 0;
    }
    else {
LAB_0025f2e6:
      if (ublindf == (obj *)0x0) {
        bVar13 = true;
      }
      else {
LAB_0025f2ef:
        bVar13 = true;
        if (ublindf->oartifact == '\x1d') goto LAB_0025f3e2;
      }
    }
    Shk_Your(local_128,(obj *)arg);
  }
  uVar3 = *(ushort *)((long)arg + 0x2a);
  uVar7 = uVar3 - 0xe5;
  if (0x26 < uVar7) {
LAB_0025f513:
    if (uVar3 != 0x142) {
      pcVar10 = xname((obj *)arg);
      warning("burn_object: unexpeced obj %s",pcVar10);
      return;
    }
    if (!bVar13) {
      if (*(byte *)((long)arg + 0x48) - 3 < 2) {
        pline("%s potion of oil has burnt away.");
      }
      else if (*(byte *)((long)arg + 0x48) == 1) {
        pline("You see a burning potion of oil go out.");
        end_burn((obj *)arg,'\0');
        obj_extract_self((obj *)arg);
        obfree((obj *)arg,(obj *)0x0);
        goto LAB_0025fa5f;
      }
    }
    end_burn((obj *)arg,'\0');
LAB_0025f706:
    obj_extract_self((obj *)arg);
    obfree((obj *)arg,(obj *)0x0);
    return;
  }
  if ((0x4000000003U >> ((ulong)uVar7 & 0x3f) & 1) == 0) {
    if ((0xcUL >> ((ulong)uVar7 & 0x3f) & 1) == 0) goto LAB_0025f513;
    iVar5 = *(int *)((long)arg + 0x5c);
    if (iVar5 < 0x32) {
      if (iVar5 == 0) {
        bVar1 = *(byte *)((long)arg + 0x48);
        if (bVar13) {
          if (bVar1 == 3) {
LAB_0025f801:
            if (uVar3 == 0xe7) {
              pcVar10 = "%s lantern has run out of power.";
LAB_0025f818:
              pline(pcVar10);
            }
            else {
              pcVar10 = xname((obj *)arg);
              pline("%s %s has gone out.",local_128,pcVar10);
            }
            goto LAB_0025f98f;
          }
        }
        else {
          if (bVar1 - 3 < 2) goto LAB_0025f801;
          if (bVar1 != 1) goto LAB_0025f993;
          if (uVar3 != 0xe7) {
            pcVar10 = xname((obj *)arg);
            an(pcVar10);
            pcVar10 = "You see %s go out.";
            goto LAB_0025f818;
          }
          pline("You see a lantern run out of power.");
LAB_0025f98f:
          *(byte *)((long)arg + 0x4a) = *(byte *)((long)arg + 0x4a) | 0x10;
        }
LAB_0025f993:
        end_burn((obj *)arg,'\0');
      }
      else {
        if ((iVar5 != 0x19) || (bVar13)) goto LAB_0025f9d7;
        if (uVar3 == 0xe7) goto LAB_0025f58e;
        if (*(byte *)((long)arg + 0x48) - 3 < 2) {
          pcVar9 = xname((obj *)arg);
          pcVar8 = "%s %s seems about to go out.";
          pcVar10 = local_128;
          goto LAB_0025f9c6;
        }
        if (*(byte *)((long)arg + 0x48) == 1) {
          pcVar10 = xname((obj *)arg);
          pcVar10 = an(pcVar10);
          pline("You see %s about to go out.",pcVar10);
          goto LAB_0025f9cd;
        }
      }
    }
    else {
      if (((iVar5 != 0x32) && (iVar5 != 0x96)) && (iVar5 != 100)) goto LAB_0025f9d7;
      if (!bVar13) {
        if (uVar3 == 0xe7) {
LAB_0025f58e:
          lantern_message((obj *)arg);
        }
        else {
          pcVar10 = "";
          if (iVar5 == 0x32) {
            pcVar10 = " considerably";
          }
          see_lamp_flicker((obj *)arg,pcVar10);
        }
      }
    }
  }
  else {
    iVar5 = *(int *)((long)arg + 0x5c);
    if (iVar5 != 0) {
      if (iVar5 == 0xf) {
        if (bVar13) goto LAB_0025f9d7;
        if (1 < *(byte *)((long)arg + 0x48) - 3) {
          if (*(byte *)((long)arg + 0x48) != 1) goto LAB_0025f9d7;
          pcVar10 = "a ";
          if (bVar12) {
            pcVar10 = "some ";
          }
          pcVar9 = "\'s";
          if (bVar12) {
            pcVar9 = "s\'";
          }
          pcVar8 = "";
          if (bVar12) {
            pcVar8 = "s";
          }
          pcVar11 = "a candelabrum\'s ";
          if (sVar2 != 0x10b) {
            pcVar11 = pcVar10;
          }
          pcVar10 = "You see %scandle%s flame%s flicker low!";
          goto LAB_0025f77a;
        }
        pcVar10 = "a candelabrum\'s ";
        if (sVar2 != 0x10b) {
          pcVar10 = "\n\n";
        }
        pcVar9 = "\'s";
        if (bVar12) {
          pcVar9 = "s\'";
        }
        pcVar11 = "s";
        pcVar8 = "";
        if (bVar12) {
          pcVar8 = "s";
          pcVar11 = "";
        }
        pline("%s %scandle%s flame%s flicker%s low!",local_128,pcVar10 + 2,pcVar9,pcVar8,pcVar11);
      }
      else {
        if ((iVar5 != 0x4b) || (bVar13)) goto LAB_0025f9d7;
        if (*(byte *)((long)arg + 0x48) - 3 < 2) {
          pcVar9 = "\n\n";
          if (sVar2 == 0x10b) {
            pcVar9 = "a candelabrum\'s ";
          }
          pcVar9 = pcVar9 + 2;
          pcVar8 = " is";
          if (bVar12) {
            pcVar8 = "s are";
          }
          pcVar10 = "%s %scandle%s getting short.";
          pcVar11 = local_128;
LAB_0025f77a:
          pline(pcVar10,pcVar11,pcVar9,pcVar8);
        }
        else {
          if (*(byte *)((long)arg + 0x48) != 1) goto LAB_0025f9d7;
          pcVar8 = "a ";
          if (bVar12) {
            pcVar8 = "some ";
          }
          pcVar9 = "";
          if (bVar12) {
            pcVar9 = "s";
          }
          pcVar10 = "a candelabrum\'s ";
          if (sVar2 != 0x10b) {
            pcVar10 = pcVar8;
          }
          pcVar8 = "You see %scandle%s getting short.";
LAB_0025f9c6:
          pline(pcVar8,pcVar10,pcVar9);
        }
      }
LAB_0025f9cd:
      *(byte *)((long)arg + 0x4a) = *(byte *)((long)arg + 0x4a) | 0x10;
      goto LAB_0025f9d1;
    }
    if ((bVar13) && (*(char *)((long)arg + 0x48) != '\x03')) {
      end_burn((obj *)arg,'\0');
      if (sVar2 != 0x10b) goto LAB_0025f706;
    }
    else {
      bVar1 = *(byte *)((long)arg + 0x48);
      if (sVar2 != 0x10b) {
        if (bVar1 - 3 < 2) {
          pcVar10 = xname((obj *)arg);
          pcVar9 = "is";
          if (bVar12) {
            pcVar9 = "are";
          }
          pline("%s %s %s consumed!",local_128,pcVar10,pcVar9);
          bVar13 = true;
LAB_0025f8c3:
          *(byte *)((long)arg + 0x4a) = *(byte *)((long)arg + 0x4a) | 0x10;
        }
        else {
          bVar13 = true;
          if (bVar1 == 1) {
            pcVar10 = "";
            pcVar9 = xname((obj *)arg);
            if (bVar12) {
              pcVar10 = "some ";
            }
            else {
              pcVar9 = an(pcVar9);
            }
            bVar13 = false;
            pline("You see %s%s consumed!",pcVar10,pcVar9);
            goto LAB_0025f8c3;
          }
        }
        if (((u.uprops[0x23].intrinsic == 0) || (u.uprops[0x24].extrinsic != 0)) ||
           ((u.umonnum != u.umonster && (bVar4 = dmgtype(youmonst.data,0x24), bVar4 != '\0')))) {
          if (u.uprops[0x1e].intrinsic == 0) {
            if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0025f928;
            if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0025f923;
LAB_0025fa22:
            pcVar9 = "Their flames die.";
            pcVar10 = "Its flame dies.";
            goto LAB_0025fa30;
          }
LAB_0025f923:
          if (ublindf != (obj *)0x0) {
LAB_0025f928:
            if (ublindf->oartifact == '\x1d') goto LAB_0025fa22;
          }
          pcVar10 = "";
        }
        else {
          pcVar9 = "They shriek!";
          pcVar10 = "It shrieks!";
LAB_0025fa30:
          if (bVar12) {
            pcVar10 = pcVar9;
          }
        }
        pline(pcVar10);
        end_burn((obj *)arg,'\0');
        obj_extract_self((obj *)arg);
        obfree((obj *)arg,(obj *)0x0);
        if (bVar13) {
          return;
        }
LAB_0025fa5f:
        newsym((int)local_129,(int)local_12a);
        return;
      }
      if (bVar1 - 3 < 2) {
        pcVar10 = " dies";
        if (bVar12) {
          pcVar10 = "s die";
        }
        pline("%s candelabrum\'s flame%s.",local_128,pcVar10);
LAB_0025f84c:
        *(byte *)((long)arg + 0x4a) = *(byte *)((long)arg + 0x4a) | 0x10;
      }
      else if (bVar1 == 1) {
        pline("You see a candelabrum\'s flame%s die.");
        goto LAB_0025f84c;
      }
      end_burn((obj *)arg,'\0');
    }
    *(undefined1 *)((long)arg + 0x34) = 0;
    iVar5 = weight((obj *)arg);
    *(int *)((long)arg + 0x2c) = iVar5;
    if (*(char *)((long)arg + 0x48) == '\x03') {
      encumber_msg();
    }
  }
LAB_0025f9d1:
  if (*(int *)((long)arg + 0x5c) == 0) {
    return;
  }
LAB_0025f9d7:
  begin_burn(level,(obj *)arg,'\x01');
  return;
}

Assistant:

void burn_object(void *arg, long timeout)
{
	struct obj *obj = (struct obj *) arg;
	boolean canseeit, many, menorah, need_newsym;
	xchar x, y;
	char whose[BUFSZ];

	menorah = obj->otyp == CANDELABRUM_OF_INVOCATION;
	many = menorah ? obj->spe > 1 : obj->quan > 1L;

	/* timeout while away */
	if (timeout != moves) {
	    long how_long = moves - timeout;

	    if (how_long >= obj->age) {
		obj->age = 0;
		end_burn(obj, FALSE);

		if (menorah) {
		    obj->spe = 0;	/* no more candles */
		    obj->owt = weight(obj);
		    if (carried(obj)) encumber_msg();
		} else if (Is_candle(obj) || obj->otyp == POT_OIL) {
		    /* get rid of candles and burning oil potions */
		    obj_extract_self(obj);
		    obfree(obj, NULL);
		    obj = NULL;
		}

	    } else {
		obj->age -= how_long;
		begin_burn(level, obj, TRUE);
	    }
	    return;
	}

	/* only interested in INVENT, FLOOR, and MINVENT */
	if (get_obj_location(obj, &x, &y, 0)) {
	    canseeit = !Blind && cansee(x, y);
	    /* set up `whose[]' to be "Your" or "Fred's" or "The goblin's" */
	    Shk_Your(whose, obj);
	} else {
	    canseeit = FALSE;
	}
	need_newsym = FALSE;

	/* obj->age is the age remaining at this point.  */
	switch (obj->otyp) {
	    case POT_OIL:
		    /* this should only be called when we run out */
		    if (canseeit) {
			switch (obj->where) {
			    case OBJ_INVENT:
			    case OBJ_MINVENT:
				pline("%s potion of oil has burnt away.",
				    whose);
				break;
			    case OBJ_FLOOR:
				pline("You see a burning potion of oil go out.");
				need_newsym = TRUE;
				break;
			}
		    }
		    end_burn(obj, FALSE);	/* turn off light source */
		    obj_extract_self(obj);
		    obfree(obj, NULL);
		    obj = NULL;
		    break;

	    case BRASS_LANTERN:
	    case OIL_LAMP:
		switch((int)obj->age) {
		    case 150:
		    case 100:
		    case 50:
			if (canseeit) {
			    if (obj->otyp == BRASS_LANTERN)
				lantern_message(obj);
			    else
				see_lamp_flicker(obj,
				    obj->age == 50L ? " considerably" : "");
			}
			break;

		    case 25:
			if (canseeit) {
			    if (obj->otyp == BRASS_LANTERN)
				lantern_message(obj);
			    else {
				switch (obj->where) {
				    case OBJ_INVENT:
				    case OBJ_MINVENT:
					pline("%s %s seems about to go out.",
					    whose, xname(obj));
					obj->known = 1;
					break;
				    case OBJ_FLOOR:
					pline("You see %s about to go out.",
					    an(xname(obj)));
					obj->known = 1;
					break;
				}
			    }
			}
			break;

		    case 0:
			/* even if blind you'll know if holding it */
			if (canseeit || obj->where == OBJ_INVENT) {
			    switch (obj->where) {
				case OBJ_INVENT:
				case OBJ_MINVENT:
				    if (obj->otyp == BRASS_LANTERN)
					pline("%s lantern has run out of power.",
					    whose);
				    else
					pline("%s %s has gone out.",
					    whose, xname(obj));
				    obj->known = 1;
				    break;
				case OBJ_FLOOR:
				    if (obj->otyp == BRASS_LANTERN)
					pline("You see a lantern run out of power.");
				    else
					pline("You see %s go out.",
					    an(xname(obj)));
				    obj->known = 1;
				    break;
			    }
			}
			end_burn(obj, FALSE);
			break;

		    default:
			/*
			 * Someone added fuel to the lamp while it was
			 * lit.  Just fall through and let begin burn
			 * handle the new age.
			 */
			break;
		}

		if (obj && obj->age)
		    begin_burn(level, obj, TRUE);

		break;

	    case CANDELABRUM_OF_INVOCATION:
	    case TALLOW_CANDLE:
	    case WAX_CANDLE:
		switch (obj->age) {
		    case 75:
			if (canseeit)
			    switch (obj->where) {
				case OBJ_INVENT:
				case OBJ_MINVENT:
				    pline("%s %scandle%s getting short.",
					whose,
					menorah ? "candelabrum's " : "",
					many ? "s are" : " is");
				    obj->known = 1;
				    break;
				case OBJ_FLOOR:
				    pline("You see %scandle%s getting short.",
					    menorah ? "a candelabrum's " :
						many ? "some " : "a ",
					    many ? "s" : "");
				    obj->known = 1;
				    break;
			    }
			break;

		    case 15:
			if (canseeit)
			    switch (obj->where) {
				case OBJ_INVENT:
				case OBJ_MINVENT:
				    pline(
					"%s %scandle%s flame%s flicker%s low!",
					    whose,
					    menorah ? "candelabrum's " : "",
					    many ? "s'" : "'s",
					    many ? "s" : "",
					    many ? "" : "s");
				    obj->known = 1;
				    break;
				case OBJ_FLOOR:
				    pline("You see %scandle%s flame%s flicker low!",
					    menorah ? "a candelabrum's " :
						many ? "some " : "a ",
					    many ? "s'" : "'s",
					    many ? "s" : "");
				    obj->known = 1;
				    break;
			    }
			break;

		    case 0:
			/* we know even if blind and in our inventory */
			if (canseeit || obj->where == OBJ_INVENT) {
			    if (menorah) {
				switch (obj->where) {
				    case OBJ_INVENT:
				    case OBJ_MINVENT:
					pline("%s candelabrum's flame%s.",
					    whose,
					    many ? "s die" : " dies");
					obj->known = 1;
					break;
				    case OBJ_FLOOR:
					pline("You see a candelabrum's flame%s die.",
						many ? "s" : "");
					obj->known = 1;
					break;
				}
			    } else {
				switch (obj->where) {
				    case OBJ_INVENT:
				    case OBJ_MINVENT:
					pline("%s %s %s consumed!",
					    whose,
					    xname(obj),
					    many ? "are" : "is");
					obj->known = 1;
					break;
				    case OBJ_FLOOR:
					/*
					You see some wax candles consumed!
					You see a wax candle consumed!
					*/
					pline("You see %s%s consumed!",
					    many ? "some " : "",
					    many ? xname(obj):an(xname(obj)));
					need_newsym = TRUE;
					obj->known = 1;
					break;
				}

				/* post message */
				pline(Hallucination ?
					(many ? "They shriek!" :
						"It shrieks!") :
					Blind ? "" :
					    (many ? "Their flames die." :
						    "Its flame dies."));
			    }
			}
			end_burn(obj, FALSE);

			if (menorah) {
			    obj->spe = 0;
			    obj->owt = weight(obj); /* no more candles */
			    if (carried(obj)) encumber_msg();
			} else {
			    obj_extract_self(obj);
			    obfree(obj, NULL);
			    obj = NULL;
			}
			break;

		    default:
			/*
			 * Someone added fuel (candles) to the menorah while
			 * it was lit.  Just fall through and let begin burn
			 * handle the new age.
			 */
			break;
		}

		if (obj && obj->age)
		    begin_burn(level, obj, TRUE);

		break;

	    default:
		warning("burn_object: unexpeced obj %s", xname(obj));
		break;
	}
	if (need_newsym) newsym(x, y);
}